

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_bonsai_trie.hpp
# Opt level: O0

node_map * __thiscall
poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::expand
          (plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *this)

{
  pointer puVar1;
  undefined1 uVar2;
  pointer puVar3;
  type_conflict *ptVar4;
  unsigned_long v;
  uint64_t *node_id_00;
  plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *in_RSI;
  plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *in_RDI;
  pair<unsigned_long,_unsigned_long> pVar5;
  pair<unsigned_long,_unsigned_long> pVar6;
  reverse_iterator rit;
  uint64_t new_node_id;
  type_conflict *label;
  type_conflict *parent;
  uint64_t node_id;
  uint64_t i;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  path;
  bit_vector done_flags;
  plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> new_ht;
  node_map *node_map;
  pointer in_stack_fffffffffffffe28;
  plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *in_stack_fffffffffffffe30;
  compact_vector *in_stack_fffffffffffffe38;
  node_map *in_stack_fffffffffffffe40;
  undefined7 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4f;
  bit_vector *in_stack_fffffffffffffe50;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *in_stack_fffffffffffffe60;
  uint64_t in_stack_fffffffffffffe70;
  uint64_t in_stack_fffffffffffffe78;
  compact_vector *in_stack_fffffffffffffe80;
  plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *this_00;
  pair<unsigned_long,_unsigned_long> local_d8;
  pointer local_c8;
  pointer local_c0;
  plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> local_70;
  
  this_00 = in_RDI;
  capa_bits((plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *)0x1d335f);
  size_p2::bits(&in_RSI->symb_size_);
  plain_bonsai_trie(this_00,(uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI);
  add_root(&local_70);
  capa_size((plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *)0x1d33b1);
  bit_vector::bit_vector
            (in_stack_fffffffffffffe50,CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48)
            );
  get_root(in_RSI);
  bit_vector::set((bit_vector *)in_stack_fffffffffffffe30,(uint64_t)in_stack_fffffffffffffe28,false)
  ;
  get_root(in_RSI);
  get_root(&local_70);
  compact_vector::set(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70)
  ;
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            *)0x1d3447);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::reserve((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             *)in_stack_fffffffffffffe60,
            CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  local_c0 = (pointer)0x2;
  while( true ) {
    puVar1 = local_c0;
    puVar3 = (pointer)compact_vector::size(&in_RSI->table_);
    if (puVar3 <= puVar1) break;
    in_stack_fffffffffffffe97 =
         bit_vector::operator[]
                   ((bit_vector *)in_stack_fffffffffffffe30,(uint64_t)in_stack_fffffffffffffe28);
    if (!(bool)in_stack_fffffffffffffe97) {
      in_stack_fffffffffffffe88 =
           (plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *)
           compact_vector::operator[]
                     (&in_stack_fffffffffffffe30->table_,(uint64_t)in_stack_fffffffffffffe28);
      if (in_stack_fffffffffffffe88 != (plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *)0x0) {
        std::
        vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::clear((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 *)0x1d3551);
        local_c8 = local_c0;
        do {
          pVar5 = get_parent_and_symb(in_stack_fffffffffffffe60,
                                      CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58))
          ;
          in_stack_fffffffffffffe60 =
               (plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *)&local_d8;
          local_d8 = pVar5;
          ptVar4 = std::get<0ul,unsigned_long,unsigned_long>
                             ((pair<unsigned_long,_unsigned_long> *)0x1d35ae);
          std::get<1ul,unsigned_long,unsigned_long>((pair<unsigned_long,_unsigned_long> *)0x1d35c0);
          pVar6 = std::make_pair<unsigned_long&,unsigned_long&>
                            ((unsigned_long *)in_stack_fffffffffffffe30,
                             &in_stack_fffffffffffffe28->first);
          v = pVar6.first;
          std::
          vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
          ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                    ((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      *)in_stack_fffffffffffffe40,
                     (pair<unsigned_long,_unsigned_long> *)in_stack_fffffffffffffe38);
          local_c8 = (pointer)*ptVar4;
          in_stack_fffffffffffffe5f =
               bit_vector::operator[]
                         ((bit_vector *)in_stack_fffffffffffffe30,
                          (uint64_t)in_stack_fffffffffffffe28);
        } while (((in_stack_fffffffffffffe5f ^ 0xff) & 1) != 0);
        node_id_00 = (uint64_t *)
                     compact_vector::operator[]
                               (&in_stack_fffffffffffffe30->table_,
                                (uint64_t)in_stack_fffffffffffffe28);
        std::
        rbegin<std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>
                  ((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    *)in_stack_fffffffffffffe28);
        while( true ) {
          std::
          rend<std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>
                    ((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      *)in_stack_fffffffffffffe28);
          uVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
                                   *)in_stack_fffffffffffffe30,
                                  (reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
                                   *)in_stack_fffffffffffffe28);
          if (!(bool)uVar2) break;
          in_stack_fffffffffffffe40 =
               (node_map *)
               std::
               reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
               ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
                             *)in_stack_fffffffffffffe30);
          add_child((plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *)
                    CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),node_id_00,
                    CONCAT17(uVar2,in_stack_fffffffffffffe48));
          in_stack_fffffffffffffe30 = in_RSI;
          in_stack_fffffffffffffe38 =
               (compact_vector *)
               std::
               reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
               ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
                             *)in_RSI);
          compact_vector::set((compact_vector *)pVar5.first,pVar5.second,v);
          in_stack_fffffffffffffe28 =
               std::
               reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
               ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
                             *)in_stack_fffffffffffffe30);
          bit_vector::set((bit_vector *)in_stack_fffffffffffffe30,
                          (uint64_t)in_stack_fffffffffffffe28,false);
          std::
          reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
          ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
                        *)in_stack_fffffffffffffe30);
        }
      }
    }
    local_c0 = (pointer)((long)local_c0 + 1);
  }
  plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::node_map::node_map
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
             (bit_vector *)in_stack_fffffffffffffe30);
  std::swap<poplar::plain_bonsai_trie<90u,poplar::hash::vigna_hasher>>
            ((plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *)
             CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),in_stack_fffffffffffffe88
            );
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             *)in_stack_fffffffffffffe40);
  bit_vector::~bit_vector((bit_vector *)0x1d381c);
  ~plain_bonsai_trie((plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *)0x1d3829);
  return (node_map *)this_00;
}

Assistant:

node_map expand() {
        plain_bonsai_trie new_ht{capa_bits() + 1, symb_size_.bits()};
        new_ht.add_root();

#ifdef POPLAR_EXTRA_STATS
        new_ht.num_resize_ = num_resize_ + 1;
#endif

        bit_vector done_flags(capa_size());
        done_flags.set(get_root());

        table_.set(get_root(), new_ht.get_root());

        std::vector<std::pair<uint64_t, uint64_t>> path;
        path.reserve(256);

        // 0 is empty, 1 is root
        for (uint64_t i = 2; i < table_.size(); ++i) {
            if (done_flags[i] || table_[i] == 0) {
                // skip already processed or empty elements
                continue;
            }

            path.clear();
            uint64_t node_id = i;

            do {
                auto [parent, label] = get_parent_and_symb(node_id);
                assert(parent != nil_id);
                path.emplace_back(std::make_pair(node_id, label));
                node_id = parent;
            } while (!done_flags[node_id]);

            uint64_t new_node_id = table_[node_id];

            for (auto rit = std::rbegin(path); rit != std::rend(path); ++rit) {
                new_ht.add_child(new_node_id, rit->second);
                table_.set(rit->first, new_node_id);
                done_flags.set(rit->first);
            }
        }

        node_map node_map{std::move(table_), std::move(done_flags)};
        std::swap(*this, new_ht);

        return node_map;
    }